

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_shape.hpp
# Opt level: O3

void __thiscall
Omega_h::MetricEdgeLengths<2,_2>::MetricEdgeLengths
          (MetricEdgeLengths<2,_2> *this,Mesh *mesh,Reals *metrics_in)

{
  Alloc *pAVar1;
  
  Omega_h::Mesh::coords((Mesh *)this);
  pAVar1 = (metrics_in->write_).shared_alloc_.alloc;
  (this->metrics).write_.shared_alloc_.alloc = pAVar1;
  if (((ulong)pAVar1 & 7) == 0 && pAVar1 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      (this->metrics).write_.shared_alloc_.alloc = (Alloc *)(pAVar1->size * 8 + 1);
    }
    else {
      pAVar1->use_count = pAVar1->use_count + 1;
    }
  }
  (this->metrics).write_.shared_alloc_.direct_ptr = (metrics_in->write_).shared_alloc_.direct_ptr;
  return;
}

Assistant:

MetricEdgeLengths(Mesh const* mesh, Reals metrics_in)
      : coords(mesh->coords()), metrics(metrics_in) {}